

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
mpt::typed_array<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>::typed_array
          (typed_array<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry> *this,long len)

{
  content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry> *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  default_data *pdVar3;
  
  (this->super_unique_array<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>)._ref._ref =
       (content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry> *)0x0;
  if (typed_array<mpt::map<mpt::laydest,mpt::reference<mpt::cycle>>::entry>::typed_array(long)::
      _dummy == '\0') {
    iVar2 = __cxa_guard_acquire(&typed_array<mpt::map<mpt::laydest,mpt::reference<mpt::cycle>>::entry>
                                 ::typed_array(long)::_dummy);
    if (iVar2 != 0) {
      typed_array::_dummy.super_default_data.
      super_content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>.super_buffer.
      _content_traits =
           type_properties<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>::traits();
      typed_array::_dummy.super_default_data.
      super_content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>.super_buffer._size =
           0;
      typed_array::_dummy.super_default_data.
      super_content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>.super_buffer._used =
           0;
      typed_array::_dummy.super_default_data.
      super_content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>.super_buffer.
      _vptr_buffer = (_func_int **)&PTR_get_flags_0014c090;
      __cxa_guard_release(&typed_array<mpt::map<mpt::laydest,mpt::reference<mpt::cycle>>::entry>::
                           typed_array(long)::_dummy);
    }
  }
  if (len < 0) {
    pdVar3 = &typed_array::_dummy;
  }
  else {
    iVar2 = (*typed_array::_dummy.super_default_data.
              super_content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>.super_buffer
              ._vptr_buffer[3])(&typed_array::_dummy,len << 4);
    pdVar3 = (default_data *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = (this->super_unique_array<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>).
           _ref._ref;
  if (pcVar1 != (content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry> *)0x0) {
    (*(pcVar1->super_buffer)._vptr_buffer[1])();
  }
  if ((content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry> *)pdVar3 ==
      (content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry> *)0x0) {
    pdVar3 = &typed_array::_dummy;
  }
  (this->super_unique_array<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry>)._ref._ref =
       (content<mpt::map<mpt::laydest,_mpt::reference<mpt::cycle>_>::entry> *)pdVar3;
  return;
}

Assistant:

typed_array(long len = -1) : unique_array<T>(static_cast<content<T> *>(0))
	{
		static default_data _dummy;
		content<T> *data = &_dummy;
		if (len >= 0) data = data->detach(len * sizeof(T));
		this->_ref.set_instance(data ? data : &_dummy);
	}